

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRHandler.cc
# Opt level: O2

BasicBlock * __thiscall flow::IRHandler::createBlock(IRHandler *this,string *name)

{
  pointer *__ptr;
  _Alloc_hider local_28;
  IRHandler *local_20;
  
  local_20 = this;
  std::make_unique<flow::BasicBlock,std::__cxx11::string_const&,flow::IRHandler*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28,
             (IRHandler **)name);
  std::__cxx11::
  list<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>,std::allocator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>>
  ::emplace_back<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>
            ((list<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>,std::allocator<std::unique_ptr<flow::BasicBlock,std::default_delete<flow::BasicBlock>>>>
              *)&this->blocks_,
             (unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_> *)&local_28);
  if ((long *)local_28._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_28._M_p + 8))();
  }
  return (BasicBlock *)
         (this->blocks_).
         super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
}

Assistant:

BasicBlock* IRHandler::createBlock(const std::string& name) {
  blocks_.emplace_back(std::make_unique<BasicBlock>(name, this));
  return blocks_.back().get();
}